

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateList.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients::generateList
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,uint na,
          vector<double,_std::allocator<double>_> *energies,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coefficients)

{
  pointer pvVar1;
  long lVar2;
  undefined8 *puVar3;
  unsigned_long args_1;
  char *args;
  pointer pvVar4;
  char *in_stack_ffffffffffffff88;
  fn<meta::id<std::vector<double,std::allocator<double>>>> local_70 [8];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_48;
  vector<double,_std::allocator<double>_> *local_38;
  
  pvVar4 = (coefficients->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (coefficients->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = (long)pvVar1 - (long)pvVar4;
  if ((long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 == lVar2 / 0x18) {
    while( true ) {
      if (pvVar4 == pvVar1) {
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        local_48 = coefficients;
        local_38 = energies;
        ranges::detail::to_container::fn<meta::id<std::vector<double,std::allocator<double>>>>::
        impl<std::vector<double,std::allocator<double>>,ranges::common_iterator<ranges::basic_iterator<ranges::join_view<ranges::zip_with_view<ranges::views::concat_fn,ranges::transform_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::views::single_fn>,ranges::ref_view<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>>>::cursor<false>>,ranges::default_sentinel_t>,ranges::join_view<ranges::zip_with_view<ranges::views::concat_fn,ranges::transform_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::views::single_fn>,ranges::ref_view<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>>>>
                  (__return_storage_ptr__,local_70,lVar2 % 0x18);
        return __return_storage_ptr__;
      }
      if ((long)(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (ulong)(na + 1)) break;
      pvVar4 = pvVar4 + 1;
    }
    tools::Log::error<char_const*>(in_stack_ffffffffffffff88);
    tools::Log::info<char_const*,unsigned_int>("Expected: {}",na + 1);
    args_1 = (long)(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    args = "Found: {}";
  }
  else {
    tools::Log::error<char_const*>(in_stack_ffffffffffffff88);
    tools::Log::info<char_const*,unsigned_long>
              ("Number of energies: {}",
               (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    args_1 = ((long)(coefficients->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(coefficients->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18;
    args = "Number of coefficient sets: {}";
  }
  tools::Log::info<char_const*,unsigned_long>(args,args_1);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = getenv;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< double >
generateList( unsigned int na,
              std::vector< double >&& energies,
              std::vector< std::vector< double > >&& coefficients ) {

  if ( energies.size() != coefficients.size() ) {

    Log::error( "The number of energies and number of sets if coefficients "
                "must be the same" );
    Log::info( "Number of energies: {}", energies.size() );
    Log::info( "Number of coefficient sets: {}", coefficients.size() );
    throw std::exception();
  }

  for ( auto& entry : coefficients ) {

    if ( 1 + na != entry.size() ) {

      Log::error( "The number of coefficients for each energy value must "
                  "be the same" );
      Log::info( "Expected: {}", 1 + na );
      Log::info( "Found: {}", entry.size() );
      throw std::exception();
    }
  }

  return ranges::to< std::vector< double > >(
           ranges::views::zip_with(
             ranges::views::concat,
             energies | ranges::cpp20::views::transform(
                            ranges::cpp20::views::single ),
             coefficients ) | ranges::views::join );
}